

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

StringRef llvm::dwarf::FormEncodingString(uint Encoding)

{
  char *pcVar1;
  size_t sVar2;
  StringRef SVar3;
  
  sVar2 = 0;
  pcVar1 = (char *)0x0;
  switch(Encoding) {
  case 1:
    sVar2 = 0xc;
    pcVar1 = "DW_FORM_addr";
    break;
  case 2:
    break;
  case 3:
    sVar2 = 0xe;
    pcVar1 = "DW_FORM_block2";
    break;
  case 4:
    sVar2 = 0xe;
    pcVar1 = "DW_FORM_block4";
    break;
  case 5:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_data2";
    break;
  case 6:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_data4";
    break;
  case 7:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_data8";
    break;
  case 8:
    sVar2 = 0xe;
    pcVar1 = "DW_FORM_string";
    break;
  case 9:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_block";
    break;
  case 10:
    sVar2 = 0xe;
    pcVar1 = "DW_FORM_block1";
    break;
  case 0xb:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_data1";
    break;
  case 0xc:
    sVar2 = 0xc;
    pcVar1 = "DW_FORM_flag";
    break;
  case 0xd:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_sdata";
    break;
  case 0xe:
    sVar2 = 0xc;
    pcVar1 = "DW_FORM_strp";
    break;
  case 0xf:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_udata";
    break;
  case 0x10:
    sVar2 = 0x10;
    pcVar1 = "DW_FORM_ref_addr";
    break;
  case 0x11:
    sVar2 = 0xc;
    pcVar1 = "DW_FORM_ref1";
    break;
  case 0x12:
    sVar2 = 0xc;
    pcVar1 = "DW_FORM_ref2";
    break;
  case 0x13:
    sVar2 = 0xc;
    pcVar1 = "DW_FORM_ref4";
    break;
  case 0x14:
    sVar2 = 0xc;
    pcVar1 = "DW_FORM_ref8";
    break;
  case 0x15:
    sVar2 = 0x11;
    pcVar1 = "DW_FORM_ref_udata";
    break;
  case 0x16:
    sVar2 = 0x10;
    pcVar1 = "DW_FORM_indirect";
    break;
  case 0x17:
    sVar2 = 0x12;
    pcVar1 = "DW_FORM_sec_offset";
    break;
  case 0x18:
    sVar2 = 0xf;
    pcVar1 = "DW_FORM_exprloc";
    break;
  case 0x19:
    sVar2 = 0x14;
    pcVar1 = "DW_FORM_flag_present";
    break;
  case 0x1a:
    sVar2 = 0xc;
    pcVar1 = "DW_FORM_strx";
    break;
  case 0x1b:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_addrx";
    break;
  case 0x1c:
    sVar2 = 0x10;
    pcVar1 = "DW_FORM_ref_sup4";
    break;
  case 0x1d:
    sVar2 = 0x10;
    pcVar1 = "DW_FORM_strp_sup";
    break;
  case 0x1e:
    sVar2 = 0xe;
    pcVar1 = "DW_FORM_data16";
    break;
  case 0x1f:
    sVar2 = 0x11;
    pcVar1 = "DW_FORM_line_strp";
    break;
  case 0x20:
    sVar2 = 0x10;
    pcVar1 = "DW_FORM_ref_sig8";
    break;
  case 0x21:
    sVar2 = 0x16;
    pcVar1 = "DW_FORM_implicit_const";
    break;
  case 0x22:
    sVar2 = 0x10;
    pcVar1 = "DW_FORM_loclistx";
    break;
  case 0x23:
    sVar2 = 0x10;
    pcVar1 = "DW_FORM_rnglistx";
    break;
  case 0x24:
    sVar2 = 0x10;
    pcVar1 = "DW_FORM_ref_sup8";
    break;
  case 0x25:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_strx1";
    break;
  case 0x26:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_strx2";
    break;
  case 0x27:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_strx3";
    break;
  case 0x28:
    sVar2 = 0xd;
    pcVar1 = "DW_FORM_strx4";
    break;
  case 0x29:
    sVar2 = 0xe;
    pcVar1 = "DW_FORM_addrx1";
    break;
  case 0x2a:
    sVar2 = 0xe;
    pcVar1 = "DW_FORM_addrx2";
    break;
  case 0x2b:
    sVar2 = 0xe;
    pcVar1 = "DW_FORM_addrx3";
    break;
  case 0x2c:
    sVar2 = 0xe;
    pcVar1 = "DW_FORM_addrx4";
    break;
  default:
    if (Encoding == 0x1f01) {
      sVar2 = 0x16;
      pcVar1 = "DW_FORM_GNU_addr_index";
    }
    else if (Encoding == 0x1f02) {
      sVar2 = 0x15;
      pcVar1 = "DW_FORM_GNU_str_index";
    }
    else if (Encoding == 0x1f20) {
      sVar2 = 0x13;
      pcVar1 = "DW_FORM_GNU_ref_alt";
    }
    else if (Encoding == 0x1f21) {
      sVar2 = 0x14;
      pcVar1 = "DW_FORM_GNU_strp_alt";
    }
  }
  SVar3.Length = sVar2;
  SVar3.Data = pcVar1;
  return SVar3;
}

Assistant:

StringRef llvm::dwarf::FormEncodingString(unsigned Encoding) {
  switch (Encoding) {
  default:
    return StringRef();
#define HANDLE_DW_FORM(ID, NAME, VERSION, VENDOR)                              \
  case DW_FORM_##NAME:                                                         \
    return "DW_FORM_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}